

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O1

void emulator_get_opcode_mnemonic(u16 opcode,char *buffer,size_t size)

{
  char *__dest;
  char cVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  undefined6 in_register_0000003a;
  char *pcVar7;
  char fmt [32];
  byte local_69;
  char local_58 [32];
  undefined1 local_38 [8];
  
  uVar6 = (uint)CONCAT62(in_register_0000003a,opcode);
  if (uVar6 < 0x100) {
    local_69 = "\x01\x03\x01\x01\x01\x01\x02\x01\x03\x01\x01\x01\x01\x01\x02\x01\x01\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x03\x01\x02\x01\x01\x01\x03\x02\x03\x03\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01"
               [opcode];
    ppcVar3 = s_opcode_mnemonic + opcode;
  }
  else {
    if ((uVar6 & 0xff00) != 0xcb00) {
      __assert_fail("(opcode & 0xff00) == 0xcb00",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator-debug.c"
                    ,0xfb,"void emulator_get_opcode_mnemonic(u16, char *, size_t)");
    }
    ppcVar3 = s_cb_opcode_mnemonic + ((ulong)opcode & 0xff);
    local_69 = 1;
  }
  pcVar7 = *ppcVar3;
  pcVar4 = local_58;
  do {
    while( true ) {
      while( true ) {
        for (; cVar1 = *pcVar7, cVar1 != '%'; pcVar7 = pcVar7 + 1) {
          if (cVar1 == '\0') {
            *pcVar4 = '\0';
            if (local_69 < 2) {
              strncpy(buffer,local_58,size);
            }
            else {
              if (local_69 == 2) {
                pcVar4 = "XX";
              }
              else {
                if (local_69 != 3) {
                  return;
                }
                pcVar4 = "XXXX";
              }
              snprintf(buffer,size,local_58,pcVar4);
            }
            return;
          }
          *pcVar4 = cVar1;
          pcVar4 = pcVar4 + 1;
        }
        pcVar5 = pcVar7 + 1;
        __dest = pcVar4 + 1;
        *pcVar4 = '%';
        iVar2 = strncmp(pcVar5,"hu",2);
        if (iVar2 != 0) break;
        pcVar4[1] = '\0';
        strncat(__dest,"4s",(size_t)(local_38 + ~(ulong)__dest));
        pcVar4 = pcVar4 + 3;
        pcVar7 = pcVar7 + 3;
      }
      iVar2 = strncmp(pcVar5,"hhu",3);
      if (iVar2 != 0) break;
      pcVar4[1] = '\0';
      pcVar5 = "-2s";
LAB_0010beb0:
      strncat(__dest,pcVar5,(size_t)(local_38 + ~(ulong)__dest));
      pcVar4 = pcVar4 + 4;
      pcVar7 = pcVar7 + 4;
    }
    iVar2 = strncmp(pcVar5,"04x",3);
    if (iVar2 == 0) {
      pcVar4[1] = '\0';
      pcVar5 = "-4s";
      goto LAB_0010beb0;
    }
    iVar2 = strncmp(pcVar5,"+hhd",4);
    if (iVar2 == 0) {
      pcVar4[1] = '\0';
      pcVar5 = "2.2s";
LAB_0010bef2:
      strncat(__dest,pcVar5,(size_t)(local_38 + ~(ulong)__dest));
      pcVar4 = pcVar4 + 5;
      pcVar7 = pcVar7 + 5;
    }
    else {
      iVar2 = strncmp(pcVar5,"04hx",4);
      if (iVar2 == 0) {
        pcVar4[1] = '\0';
        pcVar5 = "4.4s";
        goto LAB_0010bef2;
      }
      iVar2 = strncmp(pcVar5,"02hhx",5);
      if (iVar2 != 0) {
        abort();
      }
      pcVar4[1] = '\0';
      strncat(__dest,"-2.2s",(size_t)(local_38 + ~(ulong)__dest));
      pcVar4 = pcVar4 + 6;
      pcVar7 = pcVar7 + 6;
    }
  } while( true );
}

Assistant:

void emulator_get_opcode_mnemonic(u16 opcode, char* buffer, size_t size) {
  const char* orig_fmt;
  u8 num_bytes = 1;
  if (opcode >= 0x100) {
    assert((opcode & 0xff00) == 0xcb00);
    orig_fmt = s_cb_opcode_mnemonic[opcode & 0xff];
  } else {
    num_bytes = s_opcode_bytes[opcode];
    orig_fmt = s_opcode_mnemonic[opcode];
  }
  char fmt[32];
  char* dst = fmt;
  const char* src;
  for (src = orig_fmt; *src;) {
    if (*src == '%') {
      *dst++ = *src++;

      /* Replace the format specifier with a string so we can print XXXX
       * instead of numbers. This is super hacky, but eh. */

#define START if (0) ;
#define END else abort();
#define REPLACE(old, new, len)                       \
  else if (strncmp(src, old, len) == 0) {            \
    *dst = 0; /* NULL-terminate so strncat works. */ \
    strncat(dst, new, fmt + sizeof(fmt) - dst - 1);  \
    dst += len;                                      \
    src += len;                                      \
  }

      START
      REPLACE("hu", "4s", 2)
      REPLACE("hhu", "-2s", 3)
      REPLACE("04x", "-4s", 3)
      REPLACE("+hhd", "2.2s", 4)
      REPLACE("04hx", "4.4s", 4)
      REPLACE("02hhx", "-2.2s", 5)
      END

#undef START
#undef END
#undef REPLACE
    } else {
      *dst++ = *src++;
    }
  }